

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas1_z.cpp
# Opt level: O2

void zcopy(int n,complex<double> *cx,int incx,complex<double> *cy,int incy)

{
  undefined8 uVar1;
  complex<double> *pcVar2;
  long lVar3;
  complex<double> *pcVar4;
  bool bVar5;
  
  if (0 < n) {
    if (incy == 1 && incx == 1) {
      for (lVar3 = 0; (ulong)(uint)n << 4 != lVar3; lVar3 = lVar3 + 0x10) {
        uVar1 = *(undefined8 *)((long)(cx->_M_value + lVar3) + 8);
        *(undefined8 *)(cy->_M_value + lVar3) = *(undefined8 *)(cx->_M_value + lVar3);
        *(undefined8 *)((long)(cy->_M_value + lVar3) + 8) = uVar1;
      }
    }
    else {
      pcVar2 = cy + (incy >> 0x1f & (1 - n) * incy);
      pcVar4 = cx + (incx >> 0x1f & (1 - n) * incx);
      while (bVar5 = n != 0, n = n + -1, bVar5) {
        uVar1 = *(undefined8 *)(pcVar4->_M_value + 8);
        *(undefined8 *)pcVar2->_M_value = *(undefined8 *)pcVar4->_M_value;
        *(undefined8 *)(pcVar2->_M_value + 8) = uVar1;
        pcVar2 = pcVar2 + incy;
        pcVar4 = pcVar4 + incx;
      }
    }
  }
  return;
}

Assistant:

void zcopy ( int n, complex <double> cx[], int incx, complex <double> cy[],
  int incy )

//****************************************************************************80
//
//  Purpose:
//
//    ZCOPY copies a complex <double> vector.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    C++ version by John Burkardt
//
//  Reference:
//
//    Jack Dongarra, Cleve Moler, Jim Bunch, Pete Stewart,
//    LINPACK User's Guide,
//    SIAM, 1979.
//
//    Charles Lawson, Richard Hanson, David Kincaid, Fred Krogh,
//    Basic Linear Algebra Subprograms for Fortran Usage,
//    Algorithm 539,
//    ACM Transactions on Mathematical Software,
//    Volume 5, Number 3, September 1979, pages 308-323.
//
//  Parameters:
//
//    Input, int N, the number of elements in CX and CY.
//
//    Input, complex <double> CX[], the first vector.
//
//    Input, int INCX, the increment between successive entries of CX.
//
//    Output, complex <double> CY[], the second vector.
//
//    Input, int INCY, the increment between successive entries of CY.
//
{
  int i;
  int ix;
  int iy;

  if ( n <= 0 )
  {
    return;
  }

  if ( incx != 1 || incy != 1 )
  {
    if ( 0 <= incx )
    {
      ix = 0;
    }
    else
    {
      ix = ( -n + 1 ) * incx;
    }

    if ( 0 <= incy )
    {
      iy = 0;
    }
    else
    {
      iy = ( -n + 1 ) * incy;
    }

    for ( i = 0; i < n; i++ )
    {
      cy[iy] = cx[ix];
      ix = ix + incx;
      iy = iy + incy;
    }
  }
  else
  {
    for ( i = 0; i < n; i++ )
    {
      cy[i] = cx[i];
    }
  }
  return;
}